

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::parse(Reader *this,istream *is,Value *root,bool collectComments)

{
  bool bVar1;
  String doc;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_48,*(undefined8 *)(is + *(long *)(*(long *)is + -0x18) + 0xe8),
             0xffffffff,0,0xffffffff);
  bVar1 = parse(this,(char *)local_48,(char *)((long)local_48 + local_40),root,collectComments);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return bVar1;
}

Assistant:

bool Reader::parse(std::istream& is, Value& root, bool collectComments) {
  // std::istream_iterator<char> begin(is);
  // std::istream_iterator<char> end;
  // Those would allow streamed input from a file, if parse() were a
  // template function.

  // Since String is reference-counted, this at least does not
  // create an extra copy.
  String doc(std::istreambuf_iterator<char>(is), {});
  return parse(doc.data(), doc.data() + doc.size(), root, collectComments);
}